

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O1

void __thiscall QtMWidgets::TableViewCell::mouseReleaseEvent(TableViewCell *this,QMouseEvent *e)

{
  TableViewCellPrivate *pTVar1;
  
  if (((*(int *)(e + 0x40) == 1) && (pTVar1 = (this->d).d, pTVar1->clicked == true)) &&
     (pTVar1->clicked = false, pTVar1->highlightOnClick == true)) {
    QWidget::update();
  }
  e[0xc] = (QMouseEvent)0x0;
  return;
}

Assistant:

void
TableViewCell::mouseReleaseEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton && d->clicked )
	{
		d->clicked = false;

		if( d->highlightOnClick )
			update();
	}

	e->ignore();
}